

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O2

int erkStep_TakeStep(void *arkode_mem,realtype *dsmPtr,int *nflagPtr)

{
  realtype *c;
  N_Vector *X;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  
  *nflagPtr = 0;
  iVar1 = erkStep_AccessStepMem(arkode_mem,"erkStep_TakeStep",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    c = step_mem->cvals;
    X = step_mem->Xvecs;
    uVar3 = 1;
    do {
      if ((long)step_mem->stages <= (long)uVar3) {
        iVar1 = erkStep_ComputeSolutions(ark_mem,dsmPtr);
        if (iVar1 < 0) {
          return iVar1;
        }
        if (ark_mem->report == 0) {
          return 0;
        }
        fprintf((FILE *)ark_mem->diagfp,"ERKStep  etest  %li  %.16g  %.16g\n",ark_mem->h,*dsmPtr,
                ark_mem->nst);
        return 0;
      }
      ark_mem->tcur = step_mem->B->c[uVar3] * ark_mem->h + ark_mem->tn;
      if (ark_mem->report != 0) {
        fprintf((FILE *)ark_mem->diagfp,"ERKStep  step  %li  %.16g  %i  %.16g\n",ark_mem->nst,
                uVar3 & 0xffffffff);
      }
      for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        c[uVar2] = ark_mem->h * step_mem->B->A[uVar3][uVar2];
        X[uVar2] = step_mem->F[uVar2];
      }
      c[uVar3 & 0xffffffff] = 1.0;
      X[uVar3 & 0xffffffff] = ark_mem->yn;
      iVar1 = N_VLinearCombination((int)uVar3 + 1,c,X,ark_mem->ycur);
      if (iVar1 != 0) {
        return -0x1c;
      }
      if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
         (iVar1 = (*ark_mem->ProcessStage)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data),
         iVar1 != 0)) {
        return -0x26;
      }
      iVar1 = (*step_mem->f)(ark_mem->tcur,ark_mem->ycur,step_mem->F[uVar3],ark_mem->user_data);
      step_mem->nfe = step_mem->nfe + 1;
      if (iVar1 < 0) {
        return -8;
      }
      uVar3 = uVar3 + 1;
    } while (iVar1 == 0);
    iVar1 = -0xb;
  }
  return iVar1;
}

Assistant:

int erkStep_TakeStep(void* arkode_mem, realtype *dsmPtr, int *nflagPtr)
{
  int retval, is, js, nvec;
  realtype* cvals;
  N_Vector* Xvecs;
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;

  /* initialize algebraic solver convergence flag to success */
  *nflagPtr = ARK_SUCCESS;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "erkStep_TakeStep",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    ERKStep step %li,  stage 0,  h = %"RSYM",  t_n = %"RSYM"\n",
         ark_mem->nst, ark_mem->h, ark_mem->tcur);
#endif

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    ERKStep stage 0 solution:\n");
  N_VPrint(ark_mem->ycur);
  printf("    ERKStep stage RHS F[0]:\n");
  N_VPrint(step_mem->F[0]);
#endif

  /* Loop over internal stages to the step; since the method is explicit
     the first stage RHS is just the full RHS from the start of the step */
  for (is=1; is<step_mem->stages; is++) {

    /* Set current stage time(s) */
    ark_mem->tcur = ark_mem->tn + step_mem->B->c[is]*ark_mem->h;

#ifdef SUNDIALS_DEBUG
    printf("    ERKStep step %li,  stage %i,  h = %"RSYM",  t_n = %"RSYM"\n",
           ark_mem->nst, is, ark_mem->h, ark_mem->tcur);
#endif

    /* Solver diagnostics reporting */
    if (ark_mem->report)
      fprintf(ark_mem->diagfp, "ERKStep  step  %li  %"RSYM"  %i  %"RSYM"\n",
              ark_mem->nst, ark_mem->h, is, ark_mem->tcur);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                       "ARKODE::erkStep_TakeStep", "start-step",
                       "step = %li, h = "RSYM", stage = %i, tcur = %"RSYM,
                       ark_mem->nst, ark_mem->h, is, ark_mem->tcur);
#endif

    /* Set ycur to current stage solution */
    nvec = 0;
    for (js=0; js<is; js++) {
      cvals[nvec] = ark_mem->h * step_mem->B->A[is][js];
      Xvecs[nvec] = step_mem->F[js];
      nvec += 1;
    }
    cvals[nvec] = ONE;
    Xvecs[nvec] = ark_mem->yn;
    nvec += 1;

    /*   call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, ark_mem->ycur);
    if (retval != 0) return(ARK_VECTOROP_ERR);

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL) {
      retval = ark_mem->ProcessStage(ark_mem->tcur,
                                     ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0) return(ARK_POSTPROCESS_STAGE_FAIL);
    }

    /* compute updated RHS */
    retval = step_mem->f(ark_mem->tcur, ark_mem->ycur,
                         step_mem->F[is], ark_mem->user_data);
    step_mem->nfe++;
    if (retval < 0)  return(ARK_RHSFUNC_FAIL);
    if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ERKStep stage RHS F[%i]:\n",is);
    N_VPrint(step_mem->F[is]);
#endif

  } /* loop over stages */

  /* compute time-evolved solution (in ark_ycur), error estimate (in dsm) */
  retval = erkStep_ComputeSolutions(ark_mem, dsmPtr);
  if (retval < 0)  return(retval);

#ifdef SUNDIALS_DEBUG
  printf("    ERKStep error estimate = %"RSYM"\n", *dsmPtr);
#endif
#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    ERKStep updated solution:\n");
  N_VPrint(ark_mem->ycur);
#endif

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "ERKStep  etest  %li  %"RSYM"  %"RSYM"\n",
            ark_mem->nst, ark_mem->h, *dsmPtr);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::erkStep_TakeStep", "error-test",
                     "step = %li, h = "RSYM", dsm = %"RSYM,
                     ark_mem->nst, ark_mem->h, *dsmPtr);
#endif

  return(ARK_SUCCESS);
}